

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void fs_fields_at_savepoint_names(void *serializer,void *savepoint,char **names)

{
  char *__dest;
  size_type sVar1;
  char *__src;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mnames;
  char **names_local;
  void *savepoint_local;
  void *serializer_local;
  
  mnames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)names;
  ser::Serializer::FieldsAtSavepoint_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,(Serializer *)serializer,(Savepoint *)savepoint);
  local_3c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
    if ((int)sVar1 <= local_3c) break;
    __dest = *(char **)(&(mnames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                       (long)local_3c * 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,(long)local_3c);
    __src = (char *)std::__cxx11::string::c_str();
    strcpy(__dest,__src);
    local_3c = local_3c + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void fs_fields_at_savepoint_names(void* serializer, void* savepoint, char** names)
{
    const std::vector<std::string> mnames = reinterpret_cast<Serializer*>(serializer)->FieldsAtSavepoint(
        *reinterpret_cast<Savepoint*>(savepoint));

    for (int i = 0; i < (int)mnames.size(); ++i)
        std::strcpy(names[i], mnames[i].c_str());
}